

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_57051::DiskInterfaceTest::SetUp(DiskInterfaceTest *this)

{
  allocator<char> local_31;
  string local_30;
  DiskInterfaceTest *local_10;
  DiskInterfaceTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Ninja-DiskInterfaceTest",&local_31);
  ScopedTempDir::CreateAndEnter(&this->temp_dir_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

virtual void SetUp() {
    // These tests do real disk accesses, so create a temp dir.
    temp_dir_.CreateAndEnter("Ninja-DiskInterfaceTest");
  }